

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O0

route_type_t parse_route_type(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = RT_STREET_LEVEL;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      value_local._4_4_ = RT_UNDERGROUND;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        value_local._4_4_ = RT_LONG_RAIL;
      }
      else {
        iVar1 = strcmp(value,"3");
        if (iVar1 == 0) {
          value_local._4_4_ = RT_BUS;
        }
        else {
          iVar1 = strcmp(value,"4");
          if (iVar1 == 0) {
            value_local._4_4_ = RT_FERRY;
          }
          else {
            iVar1 = strcmp(value,"5");
            if (iVar1 == 0) {
              value_local._4_4_ = RT_CABLE_CAR;
            }
            else {
              iVar1 = strcmp(value,"6");
              if (iVar1 == 0) {
                value_local._4_4_ = RT_SUSPENDED;
              }
              else {
                iVar1 = strcmp(value,"7");
                if (iVar1 == 0) {
                  value_local._4_4_ = RT_FUNICULAR;
                }
                else {
                  value_local._4_4_ = RT_NOT_SET;
                }
              }
            }
          }
        }
      }
    }
  }
  return value_local._4_4_;
}

Assistant:

route_type_t parse_route_type(const char *value) {
    if (strcmp(value, "0") == 0)
        return RT_STREET_LEVEL;
    else if (strcmp(value, "1") == 0)
        return RT_UNDERGROUND;
    else if (strcmp(value, "2") == 0)
        return RT_LONG_RAIL;
    else if (strcmp(value, "3") == 0)
        return RT_BUS;
    else if (strcmp(value, "4") == 0)
        return RT_FERRY;
    else if (strcmp(value, "5") == 0)
        return RT_CABLE_CAR;
    else if (strcmp(value, "6") == 0)
        return RT_SUSPENDED;
    else if (strcmp(value, "7") == 0)
        return RT_FUNICULAR;
    else
        return RT_NOT_SET;
}